

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_t.h
# Opt level: O1

gradient_t * __thiscall tensor_t<gradient_t>::get(tensor_t<gradient_t> *this,int _x,int _y,int _z)

{
  int iVar1;
  int iVar2;
  
  if ((_y | _x | _z) < 0) {
    __assert_fail("_x >= 0 && _y >= 0 && _z >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/tensor_t.h"
                  ,0x31,"T &tensor_t<gradient_t>::get(int, int, int) [T = gradient_t]");
  }
  iVar1 = (this->size).x;
  if (((_x < iVar1) && (iVar2 = (this->size).y, _y < iVar2)) && (_z < (this->size).z)) {
    return (this->data).super__Vector_base<gradient_t,_std::allocator<gradient_t>_>._M_impl.
           super__Vector_impl_data._M_start + (uint)((iVar2 * _z + _y) * iVar1 + _x);
  }
  __assert_fail("_x < size.x && _y < size.y && _z < size.z",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/acstud[P]lab3-cnn/src/cnn/tensor_t.h"
                ,0x32,"T &tensor_t<gradient_t>::get(int, int, int) [T = gradient_t]");
}

Assistant:

T &get(int _x, int _y, int _z) {
    assert(_x >= 0 && _y >= 0 && _z >= 0);
    assert(_x < size.x && _y < size.y && _z < size.z);

    return data[
        _z * (size.x * size.y) +
            _y * (size.x) +
            _x
    ];
  }